

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::texcoord3f> *value)

{
  bool bVar1;
  texcoord3f v;
  texcoord3f local_24;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
  }
  else {
    ReadBasicType(this,&local_24);
    nonstd::optional_lite::optional<tinyusdz::value::texcoord3f>::operator=(value,&local_24);
  }
  return true;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::texcoord3f> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::texcoord3f v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}